

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shape.cpp
# Opt level: O0

double __thiscall phyr::Shape::pdf(Shape *this,Interaction *ref,Vector3f *wi)

{
  uint uVar1;
  ulong uVar2;
  Point3<double> *in_RDI;
  double dVar3;
  double dVar4;
  double pdf;
  SurfaceInteraction isectLight;
  double tHit;
  Ray ray;
  Vector3<double> *v;
  SurfaceInteraction *in_stack_fffffffffffffdb0;
  Point3<double> *in_stack_fffffffffffffdb8;
  Vector3f *in_stack_fffffffffffffdc8;
  Interaction *in_stack_fffffffffffffdd0;
  double local_220;
  undefined1 local_218 [24];
  Vector3<double> aVStack_200 [17];
  undefined1 local_60 [8];
  undefined1 local_58 [80];
  double local_8;
  
  Interaction::emitRay(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  SurfaceInteraction::SurfaceInteraction(in_stack_fffffffffffffdb0);
  uVar2 = (**(code **)((long)in_RDI->x + 0x28))(in_RDI,local_58,local_60,local_218,1);
  if ((uVar2 & 1) == 0) {
    local_8 = 0.0;
  }
  else {
    local_220 = distanceSquared<double>(in_RDI,in_stack_fffffffffffffdb8);
    v = aVStack_200;
    Vector3<double>::operator-((Vector3<double> *)in_stack_fffffffffffffdb0);
    dVar3 = absDot<double>((Normal3<double> *)in_stack_fffffffffffffdb0,v);
    dVar4 = (double)(**(code **)((long)in_RDI->x + 0x20))();
    local_220 = local_220 / (dVar3 * dVar4);
    uVar1 = std::isinf(local_220);
    if ((uVar1 & 1) != 0) {
      local_220 = 0.0;
    }
    local_8 = local_220;
  }
  return local_8;
}

Assistant:

Real Shape::pdf(const Interaction& ref, const Vector3f& wi) const {
    // Intersect sample ray with area light geometry
    Ray ray = ref.emitRay(wi);
    Real tHit;
    SurfaceInteraction isectLight;

    // Ignore any alpha textures used for trimming the shape when performing
    // this intersection.
    if (!intersectRay(ray, &tHit, &isectLight)) return 0;

    // Convert light sample weight to solid angle measure
    Real pdf = distanceSquared(ref.p, isectLight.p) / (absDot(isectLight.n, -wi) * surfaceArea());
    if (std::isinf(pdf)) pdf = 0.f;
    return pdf;
}